

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O2

bool wallet::IsBDBFile(path *path)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  error_code ec;
  ifstream file;
  uint32_t data;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::filesystem::exists(&path->super_path);
  if (bVar1) {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    uVar3 = std::filesystem::file_size((path *)path,&ec);
    if (ec._M_value != 0) {
      (**(code **)(*(long *)ec._M_cat + 0x20))
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
      std::filesystem::__cxx11::path::string((string *)&data,&path->super_path);
      logging_function._M_str = "IsBDBFile";
      logging_function._M_len = 9;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/db.cpp"
      ;
      source_file._M_len = 0x5d;
      LogPrintFormatInternal<char[10],std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,0x67,ALL,Info,(ConstevalFormatString<3U>)0x3dcb85,
                 (char (*) [10])"IsBDBFile",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 (string *)&data);
      std::__cxx11::string::~string((string *)&data);
      std::__cxx11::string::~string((string *)&file);
    }
    if (0xfff < uVar3) {
      std::ifstream::ifstream<fs::path,fs::path>((ifstream *)&file,path,_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        bVar1 = false;
      }
      else {
        std::istream::seekg((long)&file,0xc);
        data = 0;
        std::istream::read((char *)&file,(long)&data);
        bVar1 = data == 0x62310500 || data == 0x53162;
      }
      std::ifstream::~ifstream(&file);
      goto LAB_0013a2c3;
    }
  }
  bVar1 = false;
LAB_0013a2c3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBDBFile(const fs::path& path)
{
    if (!fs::exists(path)) return false;

    // A Berkeley DB Btree file has at least 4K.
    // This check also prevents opening lock files.
    std::error_code ec;
    auto size = fs::file_size(path, ec);
    if (ec) LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(path));
    if (size < 4096) return false;

    std::ifstream file{path, std::ios::binary};
    if (!file.is_open()) return false;

    file.seekg(12, std::ios::beg); // Magic bytes start at offset 12
    uint32_t data = 0;
    file.read((char*) &data, sizeof(data)); // Read 4 bytes of file to compare against magic

    // Berkeley DB Btree magic bytes, from:
    //  https://github.com/file/file/blob/5824af38469ec1ca9ac3ffd251e7afe9dc11e227/magic/Magdir/database#L74-L75
    //  - big endian systems - 00 05 31 62
    //  - little endian systems - 62 31 05 00
    return data == 0x00053162 || data == 0x62310500;
}